

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_levels_dec_utils.c
# Opt level: O0

void VFilter(SmoothParams *p)

{
  int iVar1;
  uint8_t *puVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  uint16_t uVar6;
  uint16_t new_value;
  int x;
  uint16_t sum;
  uint16_t *out;
  uint16_t *top;
  uint16_t *cur;
  int w;
  uint8_t *src;
  SmoothParams *p_local;
  
  puVar2 = p->src;
  iVar1 = p->width;
  puVar3 = p->cur;
  puVar4 = p->top;
  puVar5 = p->end;
  sum = 0;
  for (x = 0; x < iVar1; x = x + 1) {
    sum = sum + puVar2[x];
    uVar6 = puVar4[x] + sum;
    puVar5[x] = uVar6 - puVar3[x];
    puVar3[x] = uVar6;
  }
  p->top = p->cur;
  p->cur = p->cur + iVar1;
  if (p->cur == p->end) {
    p->cur = p->start;
  }
  if ((-1 < p->row) && (p->row < p->height + -1)) {
    p->src = p->src + p->stride;
  }
  return;
}

Assistant:

static void VFilter(SmoothParams* const p) {
  const uint8_t* src = p->src;
  const int w = p->width;
  uint16_t* const cur = p->cur;
  const uint16_t* const top = p->top;
  uint16_t* const out = p->end;
  uint16_t sum = 0;               // all arithmetic is modulo 16bit
  int x;

  for (x = 0; x < w; ++x) {
    uint16_t new_value;
    sum += src[x];
    new_value = top[x] + sum;
    out[x] = new_value - cur[x];  // vertical sum of 'r' pixels.
    cur[x] = new_value;
  }
  // move input pointers one row down
  p->top = p->cur;
  p->cur += w;
  if (p->cur == p->end) p->cur = p->start;  // roll-over
  // We replicate edges, as it's somewhat easier as a boundary condition.
  // That's why we don't update the 'src' pointer on top/bottom area:
  if (p->row >= 0 && p->row < p->height - 1) {
    p->src += p->stride;
  }
}